

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O0

bool __thiscall HtmlModelSerialiser::loadModel(HtmlModelSerialiser *this,QIODevice *source)

{
  QIODevice *pQVar1;
  ulong uVar2;
  QXmlStreamReader local_38 [8];
  QXmlStreamReader reader;
  HtmlModelSerialiserPrivate *d;
  QIODevice *local_20;
  QIODevice *source_local;
  HtmlModelSerialiser *this_local;
  
  if (source == (QIODevice *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_20 = source;
    source_local = (QIODevice *)this;
    uVar2 = QIODevice::isOpen();
    pQVar1 = local_20;
    if ((uVar2 & 1) == 0) {
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)((long)&d + 4),ReadOnly);
      uVar2 = (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,d._4_4_);
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = 0;
        goto LAB_0013d4a5;
      }
    }
    uVar2 = QIODevice::isReadable();
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = 0;
    }
    else {
      _reader = d_func(this);
      if ((_reader->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
          m_model == (QAbstractItemModel *)0x0) {
        this_local._7_1_ = 0;
      }
      else {
        QXmlStreamReader::QXmlStreamReader(local_38,local_20);
        this_local._7_1_ = HtmlModelSerialiserPrivate::readHtml(_reader,local_38);
        QXmlStreamReader::~QXmlStreamReader(local_38);
      }
    }
  }
LAB_0013d4a5:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HtmlModelSerialiser::loadModel(QIODevice *source)
{
    if (!source)
        return false;
    if (!source->isOpen()) {
        if (!source->open(QIODevice::ReadOnly))
            return false;
    }
    if (!source->isReadable())
        return false;
    Q_D(HtmlModelSerialiser);

    if (!d->m_model)
        return false;
    QXmlStreamReader reader(source);
    return d->readHtml(reader);
}